

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WaveletTree.h
# Opt level: O0

void __thiscall bwtil::WaveletTree::WaveletTree(WaveletTree *this,string *text,bool verbose)

{
  undefined1 auVar1 [16];
  byte bVar2;
  uchar uVar3;
  ostream *poVar4;
  ulint uVar5;
  byte *pbVar6;
  void *this_00;
  uchar *puVar7;
  uint uVar8;
  byte in_DL;
  ulong in_RSI;
  WaveletTree *in_RDI;
  undefined1 auVar9 [64];
  bool bit;
  ulint j;
  ulint i_1;
  int last_perc;
  int perc;
  uint node;
  ulint i;
  undefined1 in_stack_fffffffffffffedf;
  succinct_bitvector *in_stack_fffffffffffffee0;
  vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
  *in_stack_fffffffffffffee8;
  allocator_type *in_stack_fffffffffffffef0;
  size_type in_stack_fffffffffffffef8;
  vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
  *in_stack_ffffffffffffff00;
  ulong local_68;
  ulong local_60;
  int local_58;
  int local_54;
  uint local_50;
  ulong local_30;
  undefined1 extraout_var [56];
  
  bVar2 = in_DL & 1;
  std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::vector
            ((vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> *)
             0x16a223);
  if (bVar2 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"  Building Wavelet tree");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  uVar5 = std::__cxx11::string::length();
  in_RDI->n = uVar5;
  in_RDI->sigma = 0;
  for (local_30 = 0; local_30 < in_RDI->n; local_30 = local_30 + 1) {
    pbVar6 = (byte *)std::__cxx11::string::at(in_RSI);
    if (in_RDI->sigma < (uint)*pbVar6) {
      pbVar6 = (byte *)std::__cxx11::string::at(in_RSI);
      in_RDI->sigma = (uint)*pbVar6;
    }
  }
  in_RDI->sigma = in_RDI->sigma + 1;
  auVar9._0_8_ = std::log2<unsigned_int>(0);
  auVar9._8_56_ = extraout_var;
  auVar1 = vroundsd_avx(auVar9._0_16_,auVar9._0_16_,10);
  uVar8 = vcvttsd2usi_avx512f(auVar1);
  in_RDI->log_sigma = uVar8;
  in_RDI->number_of_nodes = (1L << ((byte)in_RDI->log_sigma & 0x3f)) - 1;
  if (bVar2 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"   Number of nodes = ");
    this_00 = (void *)std::ostream::operator<<(poVar4,in_RDI->number_of_nodes);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"   filling nodes ... ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  std::allocator<bwtil::succinct_bitvector>::allocator
            ((allocator<bwtil::succinct_bitvector> *)0x16a450);
  std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::vector
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::operator=
            ((vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> *)
             in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::~vector
            ((vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> *)
             in_stack_fffffffffffffef0);
  std::allocator<bwtil::succinct_bitvector>::~allocator
            ((allocator<bwtil::succinct_bitvector> *)0x16a49e);
  uVar5 = root(in_RDI);
  local_50 = (uint)uVar5;
  local_54 = 0;
  local_58 = -1;
  for (local_60 = 0; local_60 < in_RDI->n; local_60 = local_60 + 1) {
    if ((local_58 < local_54) && (local_54 % 10 == 0)) {
      if (bVar2 != 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,"   ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_54);
        poVar4 = std::operator<<(poVar4,"% done.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      local_58 = local_54;
    }
    for (local_68 = 0; local_68 < in_RDI->log_sigma; local_68 = local_68 + 1) {
      puVar7 = (uchar *)std::__cxx11::string::at(in_RSI);
      uVar3 = bitInChar(in_RDI,*puVar7,(uint)local_68);
      std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::operator[]
                (&in_RDI->nodes,(ulong)local_50);
      succinct_bitvector::push_back(in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf);
      if (uVar3 == '\0') {
        uVar5 = child0(in_RDI,(ulong)local_50);
        local_50 = (uint)uVar5;
      }
      else {
        uVar5 = child1(in_RDI,(ulong)local_50);
        local_50 = (uint)uVar5;
      }
    }
    uVar5 = root(in_RDI);
    local_50 = (uint)uVar5;
    local_54 = (int)((local_60 * 100) / in_RDI->n);
  }
  if (bVar2 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"   Done.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

WaveletTree(const string &text, bool verbose=false){

		if (verbose) cout << "  Building Wavelet tree"<<endl;

		this->n = text.length();
		sigma = 0;

		for(ulint i=0;i<n;i++)
			if((uchar)text.at(i)>sigma)
				sigma = (uchar)text.at(i);

		sigma++;

		log_sigma = ceil(log2(sigma));

		number_of_nodes = ((ulint)1<<log_sigma)-1;

		if (verbose) cout << "   Number of nodes = "<< number_of_nodes << endl;

		if (verbose) cout << "   filling nodes ... " << endl;

		nodes = vector<succinct_bitvector>(number_of_nodes);

		uint node = root();

		int perc=0,last_perc=-1;

		for(ulint i=0;i<n;i++){

			if(perc>last_perc and perc%10==0){

				if (verbose) cout << "   " << perc << "% done." <<endl;
				last_perc=perc;

			}

			for(ulint j=0;j<log_sigma;j++){

				bool bit = bitInChar((uchar)text.at(i),j);

				nodes[node].push_back(bit);

				node = (bit?child1(node):child0(node));

			}

			node = root();

			perc = (100*i)/n;

		}

		if (verbose) cout << "   Done." << endl;

	}